

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O0

void __thiscall Lodtalk::SpecialRuntimeObjects::createSpecialClassTable(SpecialRuntimeObjects *this)

{
  Class *pCVar1;
  reference ppCVar2;
  Metaclass *pMVar3;
  MemoryManager *this_00;
  ClassTable *this_01;
  size_type sVar4;
  ulong local_28;
  size_t i_1;
  ClassTable *classTable;
  size_t i;
  SpecialRuntimeObjects *this_local;
  
  std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>::resize
            (&this->specialClassTable,0x72);
  for (classTable = (ClassTable *)0x0; classTable < (ClassTable *)0x72;
      classTable = (ClassTable *)
                   ((long)&(classTable->sharedMutex).mutex.super___mutex_base._M_mutex + 2)) {
    pCVar1 = Class::basicNativeNewClass(this->context,(int)classTable + 1);
    ppCVar2 = std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
              ::operator[](&this->specialClassTable,(size_type)classTable);
    *ppCVar2 = &pCVar1->super_ClassDescription;
    pMVar3 = Metaclass::basicNativeNewMetaclass(this->context);
    ppCVar2 = std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
              ::operator[](&this->specialClassTable,
                           (size_type)
                           ((long)&(classTable->sharedMutex).mutex.super___mutex_base._M_mutex + 1))
    ;
    *ppCVar2 = &pMVar3->super_ClassDescription;
  }
  this_00 = VMContext::getMemoryManager(this->context);
  this_01 = MemoryManager::getClassTable(this_00);
  local_28 = 0;
  while( true ) {
    sVar4 = std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>::
            size(&this->specialClassTable);
    if (sVar4 <= local_28) break;
    ppCVar2 = std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
              ::operator[](&this->specialClassTable,local_28);
    ClassTable::addSpecialClass(this_01,*ppCVar2,local_28);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void SpecialRuntimeObjects::createSpecialClassTable()
{
    specialClassTable.resize(SpecialClassTableSize);
    for(size_t i = 0; i < SpecialClassTableSize; i += 2)
    {
        specialClassTable[i] = Class::basicNativeNewClass(context, (unsigned int) (i + 1));
        specialClassTable[i + 1] = Metaclass::basicNativeNewMetaclass(context);
    }

    // Register the special classes in the class table.
    auto classTable = context->getMemoryManager()->getClassTable();
    for(size_t i = 0; i < specialClassTable.size(); ++i)
        classTable->addSpecialClass(specialClassTable[i], i);
}